

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy.c
# Opt level: O3

log_policy
log_policy_create(log_aspect_id aspect_id,log_policy_interface iface,log_policy_ctor ctor)

{
  int iVar1;
  log_policy __ptr;
  
  if ((iface != (log_policy_interface)0x0) &&
     (__ptr = (log_policy)malloc(0x28), __ptr != (log_policy)0x0)) {
    __ptr->aspect = (log_aspect)0x0;
    __ptr->aspect_id = aspect_id;
    __ptr->data = (log_policy_data)0x0;
    __ptr->iface = iface;
    __ptr->id = 0;
    iVar1 = (*iface->create)(__ptr,ctor);
    if (iVar1 == 0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (log_policy)0x0;
}

Assistant:

log_policy log_policy_create(enum log_aspect_id aspect_id, const log_policy_interface iface, const log_policy_ctor ctor)
{
	if (iface != NULL)
	{
		log_policy policy = malloc(sizeof(struct log_policy_type));

		if (policy == NULL)
		{
			return NULL;
		}

		policy->aspect = NULL;
		policy->aspect_id = aspect_id;
		policy->data = NULL;
		policy->iface = iface;
		policy->id = 0;

		if (policy->iface->create(policy, ctor) != 0)
		{
			free(policy);

			return NULL;
		}

		return policy;
	}

	return NULL;
}